

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widget.cpp
# Opt level: O3

void __thiscall polyscope::Widget::Widget(Widget *this)

{
  _Atomic_word *p_Var1;
  int iVar2;
  WeakHandle<polyscope::Widget> WStack_48;
  
  WeakReferrable::WeakReferrable((WeakReferrable *)&this->field_0x8);
  this->_vptr_Widget = (_func_int **)0x5f27c0;
  *(undefined8 *)&this->field_0x8 = 0x5f2800;
  WeakReferrable::getWeakHandle<polyscope::Widget>
            (&WStack_48,(WeakReferrable *)&this->field_0x8,this);
  std::
  vector<polyscope::WeakHandle<polyscope::Widget>,std::allocator<polyscope::WeakHandle<polyscope::Widget>>>
  ::emplace_back<polyscope::WeakHandle<polyscope::Widget>>
            ((vector<polyscope::WeakHandle<polyscope::Widget>,std::allocator<polyscope::WeakHandle<polyscope::Widget>>>
              *)&state::widgets,&WStack_48);
  if (WStack_48.super_GenericWeakHandle.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(WStack_48.super_GenericWeakHandle.sentinel.
                 super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count
      ;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (WStack_48.super_GenericWeakHandle.sentinel.
               super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count;
      (WStack_48.super_GenericWeakHandle.sentinel.super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(WStack_48.super_GenericWeakHandle.sentinel.
         super___weak_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

Widget::Widget() { state::widgets.push_back(getWeakHandle<Widget>(this)); }